

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiCamera *pCamera)

{
  aiCamera *pCamera_local;
  ValidateDSProcess *this_local;
  
  if (pCamera->mClipPlaneNear < pCamera->mClipPlaneFar) {
    if (((pCamera->mHorizontalFOV == 0.0) && (!NAN(pCamera->mHorizontalFOV))) ||
       (3.1415927 <= pCamera->mHorizontalFOV)) {
      ReportWarning(this,"%f is not a valid value for aiCamera::mHorizontalFOV",
                    (double)pCamera->mHorizontalFOV);
    }
    return;
  }
  ReportError(this,"aiCamera::mClipPlaneFar must be >= aiCamera::mClipPlaneNear");
}

Assistant:

void ValidateDSProcess::Validate( const aiCamera* pCamera)
{
    if (pCamera->mClipPlaneFar <= pCamera->mClipPlaneNear)
        ReportError("aiCamera::mClipPlaneFar must be >= aiCamera::mClipPlaneNear");

    // FIX: there are many 3ds files with invalid FOVs. No reason to
    // reject them at all ... a warning is appropriate.
    if (!pCamera->mHorizontalFOV || pCamera->mHorizontalFOV >= (float)AI_MATH_PI)
        ReportWarning("%f is not a valid value for aiCamera::mHorizontalFOV",pCamera->mHorizontalFOV);
}